

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O2

void If_ManResetOriginalRefs(If_Man_t *p)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  uint *puVar4;
  long lVar5;
  int iVar6;
  Vec_Ptr_t *p_00;
  
  iVar6 = 0;
  while( true ) {
    p_00 = p->vObjs;
    iVar2 = p_00->nSize;
    if (iVar2 <= iVar6) break;
    pvVar3 = Vec_PtrEntry(p_00,iVar6);
    *(undefined4 *)((long)pvVar3 + 0xc) = 0;
    iVar6 = iVar6 + 1;
  }
  iVar6 = 0;
  do {
    if (iVar2 <= iVar6) {
      return;
    }
    puVar4 = (uint *)Vec_PtrEntry(p_00,iVar6);
    lVar5 = 0x18;
    if ((*puVar4 & 0xf) == 3) {
LAB_0039a076:
      piVar1 = (int *)(*(long *)((long)puVar4 + lVar5) + 0xc);
      *piVar1 = *piVar1 + 1;
    }
    else if ((*puVar4 & 0xf) == 4) {
      *(int *)(*(long *)(puVar4 + 6) + 0xc) = *(int *)(*(long *)(puVar4 + 6) + 0xc) + 1;
      lVar5 = 0x20;
      goto LAB_0039a076;
    }
    iVar6 = iVar6 + 1;
    p_00 = p->vObjs;
    iVar2 = p_00->nSize;
  } while( true );
}

Assistant:

void If_ManResetOriginalRefs( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i;
    If_ManForEachObj( p, pObj, i )
        pObj->nRefs = 0;
    If_ManForEachObj( p, pObj, i )
    {
        if ( If_ObjIsAnd(pObj) )
        {
            pObj->pFanin0->nRefs++;
            pObj->pFanin1->nRefs++;
        }
        else if ( If_ObjIsCo(pObj) )
            pObj->pFanin0->nRefs++;
    }
}